

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::anon_unknown_1::almostEqualUlps<float>(float lhs,float rhs,uint64_t maxUlpDiff)

{
  uint uVar1;
  int32_t iVar2;
  int32_t iVar3;
  int __x;
  float extraout_XMM0_Da;
  float ulpDiff;
  int32_t rc;
  int32_t lc;
  uint64_t maxUlpDiff_local;
  float rhs_local;
  float lhs_local;
  
  __x = (int)maxUlpDiff;
  uVar1 = isnan((double)(ulong)(uint)lhs);
  if (((uVar1 & 1) == 0) && (uVar1 = isnan((double)(ulong)(uint)rhs), (uVar1 & 1) == 0)) {
    iVar2 = convert(lhs);
    iVar3 = convert(rhs);
    if (iVar2 < 0 != iVar3 < 0) {
      return lhs == rhs;
    }
    clara::std::abs(__x);
    return (ulong)((long)extraout_XMM0_Da |
                  (long)(extraout_XMM0_Da - 9.223372e+18) & (long)extraout_XMM0_Da >> 0x3f) <=
           maxUlpDiff;
  }
  return false;
}

Assistant:

bool almostEqualUlps(FP lhs, FP rhs, uint64_t maxUlpDiff) {
        // Comparison with NaN should always be false.
        // This way we can rule it out before getting into the ugly details
        if (Catch::isnan(lhs) || Catch::isnan(rhs)) {
            return false;
        }

        auto lc = convert(lhs);
        auto rc = convert(rhs);

        if ((lc < 0) != (rc < 0)) {
            // Potentially we can have +0 and -0
            return lhs == rhs;
        }

        // static cast as a workaround for IBM XLC
        auto ulpDiff = std::abs(static_cast<FP>(lc - rc));
        return static_cast<uint64_t>(ulpDiff) <= maxUlpDiff;
    }